

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1185e52::QChildProcess::startProcess(QChildProcess *this)

{
  bool bVar1;
  int iVar2;
  QFlags<QProcess::UnixProcessFlag> flags_00;
  pointer pUVar3;
  char **ppcVar4;
  undefined8 *in_RDI;
  UnixProcessFlags flags;
  char *what;
  bool sigmaskHandled;
  bool sigpipeHandled;
  char **in_stack_ffffffffffffff78;
  QProcessPrivate *in_stack_ffffffffffffff80;
  QProcessPrivate *in_stack_ffffffffffffff88;
  QProcessPrivate *in_stack_ffffffffffffff90;
  __sighandler_t in_stack_ffffffffffffff98;
  UnixProcessParameters *in_stack_ffffffffffffffa0;
  QFlagsStorage<QProcess::UnixProcessFlag> local_1c;
  char *local_18;
  byte local_a;
  byte local_9;
  
  QProcessPrivate::commitChannels(in_stack_ffffffffffffff80);
  qt_safe_close((int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  if ((-1 < *(int *)(in_RDI + 0x19)) && (iVar2 = fchdir(*(int *)(in_RDI + 0x19)), iVar2 == -1)) {
    __errno_location();
    failChildProcess(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  local_9 = 0;
  local_a = 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                      *)0x7a49f1);
  if (bVar1) {
    callChildProcessModifier(in_stack_ffffffffffffff90);
    std::unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
    ::operator->((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                  *)0x7a4a1b);
    local_18 = applyProcessParameters(in_stack_ffffffffffffffa0);
    if (local_18 != (char *)0x0) {
      __errno_location();
      failChildProcess(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                       (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    local_1c.i = 0xaaaaaaaa;
    pUVar3 = std::
             unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
             ::operator->((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                           *)0x7a4a8b);
    local_1c.i = (pUVar3->processParameters).flags.
                 super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
                 super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
    flags_00 = ::operator|((enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                           (enum_type)in_stack_ffffffffffffff80);
    local_9 = QFlags<QProcess::UnixProcessFlag>::testAnyFlags
                        ((QFlags<QProcess::UnixProcessFlag> *)&local_1c,flags_00);
    local_a = QFlags<QProcess::UnixProcessFlag>::testFlag
                        ((QFlags<QProcess::UnixProcessFlag> *)in_stack_ffffffffffffff80,
                         (UnixProcessFlag)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  if ((local_9 & 1) == 0) {
    QtVforkSafe::change_sigpipe(in_stack_ffffffffffffff98);
  }
  if ((local_a & 1) == 0) {
    restoreSignalMask((QChildProcess *)in_stack_ffffffffffffff80);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<char_*[],_std::default_delete<char_*[]>_> *)0x7a4b01);
  if (bVar1) {
    ppcVar4 = (anonymous_namespace)::QChildProcess::CharPointerList::operator_cast_to_char__
                        ((CharPointerList *)0x7a4b5d);
    in_stack_ffffffffffffff88 = (QProcessPrivate *)*ppcVar4;
    ppcVar4 = (anonymous_namespace)::QChildProcess::CharPointerList::operator_cast_to_char__
                        ((CharPointerList *)0x7a4b7f);
    in_stack_ffffffffffffff80 =
         (QProcessPrivate *)
         (anonymous_namespace)::QChildProcess::CharPointerList::operator_cast_to_char__
                   ((CharPointerList *)0x7a4b94);
    qt_safe_execve((char *)ppcVar4,(char **)in_stack_ffffffffffffff88,
                   (char **)in_stack_ffffffffffffff80);
  }
  else {
    (anonymous_namespace)::QChildProcess::CharPointerList::operator_cast_to_char__
              ((CharPointerList *)0x7a4b13);
    (anonymous_namespace)::QChildProcess::CharPointerList::operator_cast_to_char__
              ((CharPointerList *)0x7a4b35);
    qt_safe_execv((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  iVar2 = (int)((ulong)*in_RDI >> 0x20);
  __errno_location();
  failChildProcess(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,iVar2);
}

Assistant:

void QChildProcess::startProcess() const noexcept
{
    // Render channels configuration.
    d->commitChannels();

    // make sure this fd is closed if execv() succeeds
    qt_safe_close(d->childStartedPipe[0]);

    // enter the working directory
    if (workingDirectory >= 0 && fchdir(workingDirectory) == -1)
        failChildProcess(d, "fchdir", errno);

    bool sigpipeHandled = false;
    bool sigmaskHandled = false;
    if (d->unixExtras) {
        // FIRST we call the user modifier function, before we dropping
        // privileges or closing non-standard file descriptors
        callChildProcessModifier(d);

        // then we apply our other user-provided parameters
        if (const char *what = applyProcessParameters(d->unixExtras->processParameters))
            failChildProcess(d, what, errno);

        auto flags = d->unixExtras->processParameters.flags;
        using P = QProcess::UnixProcessFlag;
        sigpipeHandled = flags.testAnyFlags(P::ResetSignalHandlers | P::IgnoreSigPipe);
        sigmaskHandled = flags.testFlag(P::ResetSignalHandlers);
    }
    if (!sigpipeHandled) {
        // reset the signal that we ignored
        QtVforkSafe::change_sigpipe(SIG_DFL);       // reset the signal that we ignored
    }
    if (!sigmaskHandled) {
        // restore the signal mask from the parent, if applyProcessParameters()
        // hasn't completely reset it
        restoreSignalMask();
    }

    // execute the process
    if (!envp.pointers)
        qt_safe_execv(argv[0], argv);
    else
        qt_safe_execve(argv[0], argv, envp);
    failChildProcess(d, "execve", errno);
}